

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::node_output_start
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  size_t in_RCX;
  size_t sVar1;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char_t *in_RSI;
  xml_buffered_writer *in_RDI;
  uint in_R8D;
  xml_buffered_writer *unaff_retaddr;
  char_t *name;
  char_t *default_name;
  char *s;
  xml_buffered_writer *writer_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (*(long *)(in_RSI + 8) == 0) {
    s = ":anonymous";
  }
  else {
    s = *(char **)(in_RSI + 8);
  }
  sVar1 = in_RCX;
  writer_00 = (xml_buffered_writer *)s;
  xml_buffered_writer::write(in_RDI,0x3c,in_RDX,in_RCX);
  xml_buffered_writer::write_string(in_RDI,in_RSI);
  __buf = extraout_RDX;
  if (*(long *)(in_RSI + 0x38) != 0) {
    node_output_attributes
              (unaff_retaddr,
               (xml_node_struct *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               in_RDI->buffer,(size_t)in_RSI,(uint)((ulong)in_RDX >> 0x20),(uint)in_RDX);
    sVar1 = in_RCX;
    __buf = extraout_RDX_00;
  }
  if (*(long *)(in_RSI + 0x10) == 0) {
    if (*(long *)(in_RSI + 0x20) == 0) {
      if ((in_R8D & 0x80) == 0) {
        if ((in_R8D & 4) == 0) {
          xml_buffered_writer::write(in_RDI,0x20,__buf,sVar1);
        }
        xml_buffered_writer::write(in_RDI,0x2f,(void *)0x3e,sVar1);
        bVar2 = false;
      }
      else {
        sVar1 = 0x2f;
        xml_buffered_writer::write(in_RDI,0x3e,(void *)0x3c,0x2f);
        xml_buffered_writer::write_string(in_RDI,in_RSI);
        xml_buffered_writer::write(in_RDI,0x3e,__buf_00,sVar1);
        bVar2 = false;
      }
    }
    else {
      xml_buffered_writer::write(in_RDI,0x3e,__buf,sVar1);
      bVar2 = true;
    }
  }
  else {
    xml_buffered_writer::write(in_RDI,0x3e,__buf,sVar1);
    sVar1 = (size_t)in_R8D;
    text_output(writer_00,s,0,0x1369e1);
    if (*(long *)(in_RSI + 0x20) == 0) {
      xml_buffered_writer::write(in_RDI,0x3c,(void *)0x2f,sVar1);
      xml_buffered_writer::write_string(in_RDI,in_RSI);
      xml_buffered_writer::write(in_RDI,0x3e,__buf_01,sVar1);
      bVar2 = false;
    }
    else {
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

PUGI__FN bool node_output_start(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t* name = node->name ? node->name + 0 : default_name;

		writer.write('<');
		writer.write_string(name);

		if (node->first_attribute)
			node_output_attributes(writer, node, indent, indent_length, flags, depth);

		// element nodes can have value if parse_embed_pcdata was used
		if (!node->value)
		{
			if (!node->first_child)
			{
				if (flags & format_no_empty_element_tags)
				{
					writer.write('>', '<', '/');
					writer.write_string(name);
					writer.write('>');

					return false;
				}
				else
				{
					if ((flags & format_raw) == 0)
						writer.write(' ');

					writer.write('/', '>');

					return false;
				}
			}
			else
			{
				writer.write('>');

				return true;
			}
		}
		else
		{
			writer.write('>');

			text_output(writer, node->value, ctx_special_pcdata, flags);

			if (!node->first_child)
			{
				writer.write('<', '/');
				writer.write_string(name);
				writer.write('>');

				return false;
			}
			else
			{
				return true;
			}
		}
	}